

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O1

void __thiscall CTextRender::Shutdown(CTextRender *this)

{
  CGlyphMap *this_00;
  int i;
  long lVar1;
  
  this_00 = this->m_pGlyphMap;
  if (this_00 != (CGlyphMap *)0x0) {
    CGlyphMap::~CGlyphMap(this_00);
    operator_delete(this_00,0x458);
  }
  FT_Done_FreeType(this->m_FTLibrary);
  if (this->m_paVariants != (CFontLanguageVariant *)0x0) {
    mem_free(this->m_paVariants);
  }
  lVar1 = 0;
  do {
    if (this->m_apFontData[lVar1] != (void *)0x0) {
      mem_free(this->m_apFontData[lVar1]);
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  return;
}

Assistant:

void CTextRender::Shutdown()
{
	delete m_pGlyphMap;

	FT_Done_FreeType(m_FTLibrary);

	if(m_paVariants)
		mem_free(m_paVariants);

	for(int i = 0; i < MAX_FACES; ++i)
		if(m_apFontData[i])
			mem_free(m_apFontData[i]);
}